

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.hh
# Opt level: O0

void __thiscall
tchecker::parsing::system::parser_t::
stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
::push(stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
       *this,stack_symbol_type *t)

{
  basic_symbol<tchecker::parsing::system::parser_t::by_state> *this_00;
  stack_symbol_type local_98;
  basic_symbol<tchecker::parsing::system::parser_t::by_state> *local_18;
  stack_symbol_type *t_local;
  stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
  *this_local;
  
  local_18 = &t->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>;
  t_local = (stack_symbol_type *)this;
  stack_symbol_type::stack_symbol_type(&local_98);
  std::
  vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>
  ::push_back(&this->seq_,&local_98);
  stack_symbol_type::~stack_symbol_type(&local_98);
  this_00 = &operator[](this,0)->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>;
  basic_symbol<tchecker::parsing::system::parser_t::by_state>::move(this_00,local_18);
  return;
}

Assistant:

void
      push (YY_MOVE_REF (T) t)
      {
        seq_.push_back (T ());
        operator[] (0).move (t);
      }